

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPClient.cpp
# Opt level: O2

ssize_t __thiscall
SocketPP::TCPClient::send(TCPClient *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  void *__buf_00;
  undefined4 in_register_00000034;
  Message MStack_28;
  
  Message::Message(&MStack_28,(string *)CONCAT44(in_register_00000034,__fd));
  sVar1 = send(this,(int)&MStack_28,__buf_00,__n,__flags);
  RawMsg::~RawMsg(&MStack_28.rawMsg);
  return sVar1;
}

Assistant:

ssize_t TCPClient::send(const std::string& str) {
    return send(Message(str));
}